

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

char16 * Js::FunctionProxy::WrapWithBrackets
                   (char16 *name,charcount_t sz,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  Recycler *this;
  undefined4 *puVar4;
  char16 *pcVar5;
  uint uVar6;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  uVar6 = sz + 3;
  local_58 = (undefined1  [8])&char16_t::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_2ab601b;
  data.filename._0_4_ = 0xab8;
  data.plusSize = (ulong)uVar6;
  this = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_58);
  if (uVar6 == 0) {
    Memory::Recycler::ClearTrackAllocInfo(this,(TrackAllocData *)0x0);
    pcVar5 = (char16 *)&DAT_00000008;
  }
  else {
    BVar3 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_0076cff6;
      *puVar4 = 0;
    }
    pcVar5 = (char16 *)
             Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                       (this,(ulong)uVar6 * 2);
    if (pcVar5 == (char16 *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) {
LAB_0076cff6:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  *pcVar5 = L'[';
  js_wmemcpy_s(pcVar5 + 1,(ulong)sz,name,(ulong)sz);
  pcVar5[sz + 1] = L']';
  pcVar5[sz + 2] = L'\0';
  return pcVar5;
}

Assistant:

const char16* FunctionProxy::WrapWithBrackets(const char16* name, charcount_t sz, ScriptContext* scriptContext)
    {
        char16 * wrappedName = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, sz + 3); //[]\0
        wrappedName[0] = _u('[');
        char16 *next = wrappedName;
        js_wmemcpy_s(++next, sz, name, sz);
        wrappedName[sz + 1] = _u(']');
        wrappedName[sz + 2] = _u('\0');
        return wrappedName;

    }